

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (FileDescriptorProto *file_proto,DescriptorPool *alternate_pool,
               FieldDescriptorSet *extensions,string *file_data)

{
  FieldDescriptorSet *this;
  bool bVar1;
  Descriptor *this_00;
  string *psVar2;
  Message *pMVar3;
  pointer pMVar4;
  MessageLite *this_01;
  LogMessage *pLVar5;
  type message;
  LogFinisher local_1ba;
  byte local_1b9;
  LogMessage local_1b8;
  LogFinisher local_17a;
  byte local_179;
  LogMessage local_178;
  LogFinisher local_13a;
  byte local_139;
  LogMessage local_138;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_100;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  dynamic_file_proto;
  DynamicMessageFactory factory;
  LogMessage local_68;
  Descriptor *local_30;
  Descriptor *file_proto_desc;
  string *file_data_local;
  FieldDescriptorSet *extensions_local;
  DescriptorPool *alternate_pool_local;
  FileDescriptorProto *file_proto_local;
  
  file_proto_desc = (Descriptor *)file_data;
  file_data_local = (string *)extensions;
  extensions_local = (FieldDescriptorSet *)alternate_pool;
  alternate_pool_local = (DescriptorPool *)file_proto;
  bVar1 = CollectExtensions(&file_proto->super_Message,extensions);
  this = extensions_local;
  if (!bVar1) {
    this_00 = FileDescriptorProto::GetDescriptor();
    psVar2 = Descriptor::full_name_abi_cxx11_(this_00);
    local_30 = DescriptorPool::FindMessageTypeByName((DescriptorPool *)this,psVar2);
    if (local_30 == (Descriptor *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x83);
      pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: file_proto_desc: ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"Find unknown fields in FileDescriptorProto when building ");
      psVar2 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alternate_pool_local);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar2);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          ". It\'s likely that those fields are custom options, however, descriptor.proto is not in the transitive dependencies. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=
                ((LogFinisher *)
                 ((long)&factory.prototypes_mutex_.mu_.super___mutex_base._M_mutex.__data.__list.
                         __next + 3),pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
    }
    DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&dynamic_file_proto);
    pMVar3 = DynamicMessageFactory::GetPrototype
                       ((DynamicMessageFactory *)&dynamic_file_proto,local_30);
    pMVar3 = Message::New(pMVar3);
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)&local_100,pMVar3);
    pMVar4 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::get(&local_100);
    local_139 = 0;
    if (pMVar4 == (pointer)0x0) {
      internal::LogMessage::LogMessage
                (&local_138,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8c);
      local_139 = 1;
      pLVar5 = internal::LogMessage::operator<<
                         (&local_138,"CHECK failed: dynamic_file_proto.get() != NULL: ");
      internal::LogFinisher::operator=(&local_13a,pLVar5);
    }
    if ((local_139 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_138);
    }
    this_01 = &std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator->(&local_100)->super_MessageLite;
    local_179 = 0;
    bVar1 = MessageLite::ParseFromString(this_01,(ConstStringParam)file_proto_desc);
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_178,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8d);
      local_179 = 1;
      pLVar5 = internal::LogMessage::operator<<
                         (&local_178,
                          "CHECK failed: dynamic_file_proto->ParseFromString(file_data): ");
      internal::LogFinisher::operator=(&local_17a,pLVar5);
    }
    if ((local_179 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_178);
    }
    std::
    set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::clear((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)file_data_local);
    local_1b9 = 0;
    message = std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::operator*(&local_100);
    bVar1 = CollectExtensions(message,(FieldDescriptorSet *)file_data_local);
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_1b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x93);
      local_1b9 = 1;
      pLVar5 = internal::LogMessage::operator<<
                         (&local_1b8,
                          "CHECK failed: CollectExtensions(*dynamic_file_proto, extensions): ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"Find unknown fields in FileDescriptorProto when building ");
      psVar2 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alternate_pool_local);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar2);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          ". It\'s likely that those fields are custom options, however, those options cannot be recognized in the builder pool. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=(&local_1ba,pLVar5);
    }
    if ((local_1b9 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_1b8);
    }
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_100);
    DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&dynamic_file_proto);
  }
  return;
}

Assistant:

void CollectExtensions(const FileDescriptorProto& file_proto,
                       const DescriptorPool& alternate_pool,
                       FieldDescriptorSet* extensions,
                       const std::string& file_data) {
  if (!CollectExtensions(file_proto, extensions)) {
    // There are unknown fields in the file_proto, which are probably
    // extensions. We need to parse the data into a dynamic message based on the
    // builder-pool to find out all extensions.
    const Descriptor* file_proto_desc = alternate_pool.FindMessageTypeByName(
        file_proto.GetDescriptor()->full_name());
    GOOGLE_CHECK(file_proto_desc)
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "descriptor.proto is not in the transitive dependencies. "
           "This normally should not happen. Please report a bug.";
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_file_proto(
        factory.GetPrototype(file_proto_desc)->New());
    GOOGLE_CHECK(dynamic_file_proto.get() != NULL);
    GOOGLE_CHECK(dynamic_file_proto->ParseFromString(file_data));

    // Collect the extensions again from the dynamic message. There should be no
    // more unknown fields this time, i.e. all the custom options should be
    // parsed as extensions now.
    extensions->clear();
    GOOGLE_CHECK(CollectExtensions(*dynamic_file_proto, extensions))
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "those options cannot be recognized in the builder pool. "
           "This normally should not happen. Please report a bug.";
  }
}